

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

shared_ptr<libtorrent::torrent_plugin> __thiscall
libtorrent::aux::session_impl::session_plugin_wrapper::new_torrent
          (session_plugin_wrapper *this,torrent_handle *t,client_data_t user)

{
  shared_ptr<libtorrent::torrent_plugin> sVar1;
  
  sVar1 = ::std::
          function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
          ::operator()((function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
                        *)this,(torrent_handle *)
                               &(t->m_torrent).
                                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,user);
  sVar1.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar1.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> new_torrent(torrent_handle const& t, client_data_t const user) override
				{ return m_f(t, user); }